

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStructTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderStructCase::ShaderStructCase
          (ShaderStructCase *this,Context *context,char *name,char *description,bool isVertexCase,
          bool usesTextures,ShaderEvalFunc evalFunc,SetupUniformsFunc setupUniformsFunc,
          char *vertShaderSource,char *fragShaderSource)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  bool usesTextures_local;
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderStructCase *this_local;
  
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext(context);
  ctxInfo = gles3::Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,isVertexCase,
             evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderStructCase_0329ac38;
  this->m_setupUniforms = setupUniformsFunc;
  this->m_usesTexture = usesTextures;
  this->m_brickTexture = (Texture2D *)0x0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,vertShaderSource);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,fragShaderSource);
  return;
}

Assistant:

ShaderStructCase::ShaderStructCase (Context& context, const char* name, const char* description, bool isVertexCase, bool usesTextures, ShaderEvalFunc evalFunc, SetupUniformsFunc setupUniformsFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
	, m_setupUniforms	(setupUniformsFunc)
	, m_usesTexture		(usesTextures)
	, m_brickTexture	(DE_NULL)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}